

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader_database.cpp
# Opt level: O2

string * read_shader_code_file(string *__return_storage_ptr__,string *p_path,ShaderType p_type)

{
  string local_3d0 [32];
  failure e;
  undefined1 local_3a0 [376];
  ifstream ifs;
  streambuf local_218 [504];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::ifstream::ifstream(&ifs);
  std::ios::exceptions((int)&ifs + (int)*(undefined8 *)(_ifs + -0x18));
  std::ifstream::open((string *)&ifs,(_Ios_Openmode)p_path);
  std::__cxx11::stringstream::stringstream((stringstream *)&e);
  std::ostream::operator<<(local_3a0,local_218);
  std::ifstream::close();
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_3d0);
  std::__cxx11::string::~string(local_3d0);
  std::__cxx11::stringstream::~stringstream((stringstream *)&e);
  std::ifstream::~ifstream(&ifs);
  return __return_storage_ptr__;
}

Assistant:

std::string read_shader_code_file(
    const std::string &p_path,
    const ShaderType p_type)
{
    std::string content;
    std::ifstream ifs;
    ifs.exceptions(std::ifstream::failbit | std::ifstream::badbit);
    try
    {
        ifs.open(p_path);
        std::stringstream fragment_shader_stream;
        fragment_shader_stream << ifs.rdbuf();
        ifs.close();
        content = fragment_shader_stream.str();
    }
    catch (std::ifstream::failure e)
    {
        std::cerr << "shader file could not be loaded p_path:" << p_path << "\n";
    }
    return content;
}